

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderCancelRequest.h
# Opt level: O0

void __thiscall
FIX41::OrderCancelRequest::OrderCancelRequest
          (OrderCancelRequest *this,OrigClOrdID *aOrigClOrdID,ClOrdID *aClOrdID,Symbol *aSymbol,
          Side *aSide)

{
  MsgType local_88;
  Side *local_30;
  Side *aSide_local;
  Symbol *aSymbol_local;
  ClOrdID *aClOrdID_local;
  OrigClOrdID *aOrigClOrdID_local;
  OrderCancelRequest *this_local;
  
  local_30 = aSide;
  aSide_local = (Side *)aSymbol;
  aSymbol_local = (Symbol *)aClOrdID;
  aClOrdID_local = (ClOrdID *)aOrigClOrdID;
  aOrigClOrdID_local = (OrigClOrdID *)this;
  MsgType();
  FIX41::Message::Message(&this->super_Message,&local_88);
  FIX::MsgType::~MsgType(&local_88);
  *(undefined ***)&this->super_Message = &PTR__OrderCancelRequest_0018a268;
  set(this,(OrigClOrdID *)aClOrdID_local);
  set(this,(ClOrdID *)aSymbol_local);
  set(this,(Symbol *)aSide_local);
  set(this,local_30);
  return;
}

Assistant:

OrderCancelRequest(
      const FIX::OrigClOrdID& aOrigClOrdID,
      const FIX::ClOrdID& aClOrdID,
      const FIX::Symbol& aSymbol,
      const FIX::Side& aSide )
    : Message(MsgType())
    {
      set(aOrigClOrdID);
      set(aClOrdID);
      set(aSymbol);
      set(aSide);
    }